

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::insert(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *this
        ,size_t i)

{
  long lVar1;
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> SVar2;
  
  SVar2 = this[0x89];
  if (SVar2 == this[0x88]) {
    addStorage(this);
    SVar2 = this[0x89];
  }
  lVar1 = (ulong)((uint)(byte)SVar2 * 8) * 5;
  this[0x89] = *(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 *)(*(long *)(this + 0x80) + lVar1);
  this[i] = SVar2;
  return (Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)
         (lVar1 + *(long *)(this + 0x80));
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }